

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midistream.cpp
# Opt level: O1

int __thiscall
MIDIStreamer::FillBuffer(MIDIStreamer *this,int buffer_num,int max_events,DWORD max_time)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  DWORD (*paDVar6) [384];
  DWORD DVar7;
  DWORD (*paDVar8) [384];
  
  if ((this->Restarting == false) &&
     (iVar2 = (*(this->super_MusInfo)._vptr_MusInfo[0x19])(this), (char)iVar2 != '\0')) {
    return 1;
  }
  paDVar6 = this->Events + buffer_num;
  paDVar8 = paDVar6;
  if (this->InitialPlayback == true) {
    this->InitialPlayback = false;
    (*paDVar6)[0] = 0;
    this->Events[buffer_num][1] = 0;
    this->Events[buffer_num][2] = 0x80000008;
    this->Events[buffer_num][3] = 0x47f7ff0;
    this->Events[buffer_num][4] = 0xf77f7f01;
    paDVar8 = (DWORD (*) [384])(this->Events[buffer_num] + 5);
    (*(this->super_MusInfo)._vptr_MusInfo[0x17])(this);
  }
  if ((this->VolumeChanged == true) &&
     (((this->super_MusInfo).m_Status != STATE_Paused || (this->NewVolume == 0)))) {
    this->VolumeChanged = false;
    lVar5 = 0;
    do {
      bVar1 = this->ChannelVolumes[lVar5];
      DVar7 = this->NewVolume;
      *(DWORD *)((long)paDVar8 + 0) = 0;
      *(DWORD *)((long)paDVar8 + 4) = 0;
      (*paDVar8)[2] = (uint)lVar5 | (bVar1 + 1) * DVar7 & 0xff0000 | 0x7b0;
      paDVar8 = (DWORD (*) [384])(*paDVar8 + 3);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
  }
  if ((this->super_MusInfo).m_Status == STATE_Paused) {
    uVar3 = ((max_time / 3) * this->Division) / (uint)this->Tempo;
    (*paDVar8)[0] = uVar3 + (uVar3 == 0);
    *(DWORD *)((long)paDVar8 + 4) = 0;
    *(DWORD *)((long)paDVar8 + 8) = 0x2000000;
    iVar2 = (int)paDVar8 + 0xc;
  }
  else {
    if (this->Restarting == true) {
      this->Restarting = false;
      *(DWORD *)((long)paDVar8 + 0) = 0;
      *(DWORD *)((long)paDVar8 + 4) = 0;
      (*paDVar8)[2] = this->InitialTempo | 0x1000000;
      paDVar8 = (DWORD (*) [384])(*paDVar8 + 3);
      DVar7 = 0x79b0;
      do {
        *(DWORD *)((long)paDVar8 + 0) = 0;
        *(DWORD *)((long)paDVar8 + 4) = 0;
        (*paDVar8)[2] = DVar7 + 0x200;
        *(DWORD *)((long)paDVar8 + 0xc) = 0;
        *(DWORD *)((long)paDVar8 + 0x10) = 0;
        (*paDVar8)[5] = DVar7;
        paDVar8 = (DWORD (*) [384])(*paDVar8 + 6);
        DVar7 = DVar7 + 1;
      } while (DVar7 != 0x79c0);
      (*(this->super_MusInfo)._vptr_MusInfo[0x18])(this);
    }
    iVar2 = (*(this->super_MusInfo)._vptr_MusInfo[0x1c])
                      (this,paDVar8,this->Events[buffer_num] + (max_events * 3 + -3),(ulong)max_time
                      );
  }
  this->Buffer[buffer_num].lpData = (BYTE *)0x0;
  this->Buffer[buffer_num].dwBufferLength = 0;
  this->Buffer[buffer_num].dwBytesRecorded = 0;
  this->Buffer[buffer_num].lpNext = (MIDIHDR *)0x0;
  this->Buffer[buffer_num].lpData = (BYTE *)paDVar6;
  DVar7 = iVar2 - (int)paDVar6;
  this->Buffer[buffer_num].dwBufferLength = DVar7;
  this->Buffer[buffer_num].dwBytesRecorded = DVar7;
  iVar4 = (*this->MIDI->_vptr_MIDIDevice[0xc])();
  iVar2 = iVar4 * 4 + 2;
  if (iVar4 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int MIDIStreamer::FillBuffer(int buffer_num, int max_events, DWORD max_time)
{
	if (!Restarting && CheckDone())
	{
		return SONG_DONE;
	}

	int i;
	DWORD *events = Events[buffer_num], *max_event_p;
	DWORD tot_time = 0;
	DWORD time = 0;

	// The final event is for a NOP to hold the delay from the last event.
	max_event_p = events + (max_events - 1) * 3;

	if (InitialPlayback)
	{
		InitialPlayback = false;
		// Send the full master volume SysEx message.
		events[0] = 0;								// dwDeltaTime
		events[1] = 0;								// dwStreamID
		events[2] = (MEVT_LONGMSG << 24) | 8;		// dwEvent
		events[3] = MAKE_ID(0xf0,0x7f,0x7f,0x04);	// dwParms[0]
		events[4] = MAKE_ID(0x01,0x7f,0x7f,0xf7);	// dwParms[1]
		events += 5;
		DoInitialSetup();
	}

	// If the volume has changed, stick those events at the start of this buffer.
	if (VolumeChanged && (m_Status != STATE_Paused || NewVolume == 0))
	{
		VolumeChanged = false;
		for (i = 0; i < 16; ++i)
		{
			BYTE courseVol = (BYTE)(((ChannelVolumes[i]+1) * NewVolume) >> 16);
			events[0] = 0;				// dwDeltaTime
			events[1] = 0;				// dwStreamID
			events[2] = MIDI_CTRLCHANGE | i | (7<<8) | (courseVol<<16);
			events += 3;
		}
	}

	// Play nothing while paused.
	if (m_Status == STATE_Paused)
	{
		// Be more responsive when unpausing by only playing each buffer
		// for a third of the maximum time.
		events[0] = MAX<DWORD>(1, (max_time / 3) * Division / Tempo);
		events[1] = 0;
		events[2] = MEVT_NOP << 24;
		events += 3;
	}
	else
	{
		if (Restarting)
		{
			Restarting = false;
			// Reset the tempo to the inital value.
			events[0] = 0;									// dwDeltaTime
			events[1] = 0;									// dwStreamID
			events[2] = (MEVT_TEMPO << 24) | InitialTempo;	// dwEvent
			events += 3;
			// Stop all notes in case any were left hanging.
			events = WriteStopNotes(events);
			DoRestart();
		}
		events = MakeEvents(events, max_event_p, max_time);
	}
	memset(&Buffer[buffer_num], 0, sizeof(MIDIHDR));
	Buffer[buffer_num].lpData = (LPSTR)Events[buffer_num];
	Buffer[buffer_num].dwBufferLength = DWORD((LPSTR)events - Buffer[buffer_num].lpData);
	Buffer[buffer_num].dwBytesRecorded = Buffer[buffer_num].dwBufferLength;
	if (0 != (i = MIDI->PrepareHeader(&Buffer[buffer_num])))
	{
		return SONG_ERROR | (i << 2);
	}
	return SONG_MORE;
}